

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionBody::IsSimpleJitOriginalEntryPoint(FunctionBody *this)

{
  FunctionEntryPointInfo *this_00;
  JavascriptMethod p_Var1;
  JavascriptMethod p_Var2;
  undefined1 local_19;
  FunctionEntryPointInfo *simpleJitEntryPointInfo;
  FunctionBody *this_local;
  
  this_00 = GetSimpleJitEntryPointInfo(this);
  local_19 = false;
  if (this_00 != (FunctionEntryPointInfo *)0x0) {
    p_Var1 = EntryPointInfo::GetNativeEntrypoint(&this_00->super_EntryPointInfo);
    p_Var2 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
    local_19 = p_Var1 == p_Var2;
  }
  return local_19;
}

Assistant:

bool FunctionBody::IsSimpleJitOriginalEntryPoint() const
    {
#if ENABLE_NATIVE_CODEGEN
        const FunctionEntryPointInfo *const simpleJitEntryPointInfo = GetSimpleJitEntryPointInfo();
        return simpleJitEntryPointInfo && simpleJitEntryPointInfo->GetNativeEntrypoint() == GetOriginalEntryPoint_Unchecked();
#else
        return false;
#endif
    }